

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

ByteData * cfd::core::CryptoUtil::DecodeBase64(ByteData *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  string *psVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_type s1;
  ByteData *byteData;
  ulong uVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> cdst;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst;
  byte local_7a;
  char local_79;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  ByteData *local_58;
  string *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  if ((str->_M_string_length & 3) == 0) {
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar *)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
    if (str->_M_string_length != 0) {
      uVar11 = 0;
      local_58 = __return_storage_ptr__;
      local_50 = str;
      do {
        psVar3 = local_50;
        pcVar2 = (local_50->_M_dataplus)._M_p;
        if ((pcVar2[uVar11] == '=') || (pcVar2[uVar11 + 1] == '=')) {
          ByteData::ByteData(__return_storage_ptr__,&local_48);
          goto LAB_0040f7e7;
        }
        uVar8 = (ulong)(uint)(int)pcVar2[uVar11];
        if (pcVar2[uVar11 + 2] == '=') {
          lVar7 = ::std::__cxx11::string::find('\x10',uVar8);
          uVar11 = ::std::__cxx11::string::find
                             ('\x10',(ulong)(uint)(int)(psVar3->_M_dataplus)._M_p[uVar11 + 1]);
          if ((lVar7 == -1) || (uVar11 == 0xffffffffffffffff)) {
            ByteData::ByteData(__return_storage_ptr__,&local_48);
            goto LAB_0040f7e7;
          }
          local_7a = ((byte)(uVar11 >> 4) & 3) + (char)lVar7 * '\x04';
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_7a);
          }
          else {
            *local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_7a;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          break;
        }
        cVar1 = pcVar2[uVar11 + 3];
        lVar7 = ::std::__cxx11::string::find('\x10',uVar8);
        uVar8 = ::std::__cxx11::string::find
                          ('\x10',(ulong)(uint)(int)(psVar3->_M_dataplus)._M_p[uVar11 + 1]);
        uVar9 = ::std::__cxx11::string::find
                          ('\x10',(ulong)(uint)(int)(psVar3->_M_dataplus)._M_p[uVar11 + 2]);
        __return_storage_ptr__ = local_58;
        if (cVar1 == '=') {
          if (((lVar7 == -1) || (uVar8 == 0xffffffffffffffff)) || (uVar9 == 0xffffffffffffffff)) {
            ByteData::ByteData(local_58,&local_48);
            goto LAB_0040f7e7;
          }
          local_7a = ((byte)(uVar8 >> 4) & 3) + (char)lVar7 * '\x04';
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_7a);
          }
          else {
            *local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_7a;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_7a = (byte)((uint)uVar9 >> 2) & 0xf | (byte)((int)uVar8 << 4);
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_7a);
            __return_storage_ptr__ = local_58;
          }
          else {
            *local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_7a;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            __return_storage_ptr__ = local_58;
          }
          break;
        }
        lVar10 = ::std::__cxx11::string::find
                           ('\x10',(ulong)(uint)(int)(psVar3->_M_dataplus)._M_p[uVar11 + 3]);
        __return_storage_ptr__ = local_58;
        local_79 = lVar10 != -1 &&
                   ((uVar9 != 0xffffffffffffffff && uVar8 != 0xffffffffffffffff) && lVar7 != -1);
        if (lVar10 != -1 &&
            ((uVar9 != 0xffffffffffffffff && uVar8 != 0xffffffffffffffff) && lVar7 != -1)) {
          local_7a = ((byte)(uVar8 >> 4) & 3) + (char)lVar7 * '\x04';
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_7a);
          }
          else {
            *local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_7a;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_7a = (byte)(uVar9 >> 2) & 0xf | (byte)((int)uVar8 << 4);
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_7a);
          }
          else {
            *local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_7a;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_7a = (byte)lVar10 & 0x3f | (byte)((uint)uVar9 << 6);
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_7a);
            __return_storage_ptr__ = local_58;
          }
          else {
            *local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_7a;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            __return_storage_ptr__ = local_58;
          }
        }
        else {
          ByteData::ByteData(local_58,&local_48);
        }
        if (local_79 == '\0') goto LAB_0040f7e7;
        uVar11 = uVar11 + 4;
      } while (uVar11 < local_50->_M_string_length);
    }
    puVar6 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar5 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar4;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar6;
    ByteData::ByteData(__return_storage_ptr__,&local_48);
LAB_0040f7e7:
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    ByteData::ByteData(__return_storage_ptr__,&local_48);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::DecodeBase64(const std::string &str) {
  std::vector<uint8_t> dst;
  if (str.size() & 0x00000003) {
    ByteData byteData(dst);
    return byteData;
  }

  std::vector<uint8_t> cdst;
  for (std::size_t i = 0; i < str.size(); i += 4) {
    if (str[i + 0] == '=') {
      ByteData byteData(dst);
      return byteData;

    } else if (str[i + 1] == '=') {
      ByteData byteData(dst);
      return byteData;

    } else if (str[i + 2] == '=') {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);

      if (s1 == std::string::npos || s2 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));

      break;
    } else if (str[i + 3] == '=') {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);
      const std::string::size_type s3 = kBase64EncodeTable.find(str[i + 2]);

      if (s1 == std::string::npos || s2 == std::string::npos ||
          s3 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));
      cdst.push_back(
          static_cast<uint8_t>(((s2 & 0x0F) << 4) | ((s3 & 0x3C) >> 2)));

      break;
    } else {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);
      const std::string::size_type s3 = kBase64EncodeTable.find(str[i + 2]);
      const std::string::size_type s4 = kBase64EncodeTable.find(str[i + 3]);

      if (s1 == std::string::npos || s2 == std::string::npos ||
          s3 == std::string::npos || s4 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));
      cdst.push_back(
          static_cast<uint8_t>(((s2 & 0x0F) << 4) | ((s3 & 0x3C) >> 2)));
      cdst.push_back(
          static_cast<uint8_t>(((s3 & 0x03) << 6) | ((s4 & 0x3F) >> 0)));
    }
  }
  dst.swap(cdst);
  ByteData byteData(dst);
  return byteData;
}